

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall
leveldb::log::LogTest_BadRecordType_Test::~LogTest_BadRecordType_Test
          (LogTest_BadRecordType_Test *this)

{
  LogTest_BadRecordType_Test *this_local;
  
  ~LogTest_BadRecordType_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(LogTest, BadRecordType) {
  Write("foo");
  // Type is stored in header[6]
  IncrementByte(6, 100);
  FixChecksum(0, 3);
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(3, DroppedBytes());
  ASSERT_EQ("OK", MatchError("unknown record type"));
}